

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.h
# Opt level: O2

void __thiscall
slang::ast::StatementList::visitStmts<slang::ast::CheckerMemberVisitor&>
          (StatementList *this,CheckerMemberVisitor *visitor)

{
  pointer ppSVar1;
  size_t sVar2;
  long lVar3;
  
  ppSVar1 = (this->list)._M_ptr;
  sVar2 = (this->list)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    Statement::visit<slang::ast::CheckerMemberVisitor&>
              (*(Statement **)((long)ppSVar1 + lVar3),visitor);
  }
  return;
}

Assistant:

void visitStmts(TVisitor&& visitor) const {
        for (auto stmt : list)
            stmt->visit(visitor);
    }